

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchCnf.c
# Opt level: O2

void Dch_AddClausesMux(Dch_Man_t *p,Aig_Obj_t *pNode)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  Aig_Obj_t *pAVar4;
  int iVar5;
  int iVar6;
  Aig_Obj_t *pAVar7;
  uint uVar8;
  char *__assertion;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int pLits [4];
  Aig_Obj_t *pNodeE;
  Aig_Obj_t *pNodeT;
  ulong local_40;
  ulong local_38;
  
  if (((ulong)pNode & 1) == 0) {
    iVar5 = Aig_ObjIsMuxType(pNode);
    if (iVar5 == 0) {
      __assertion = "Aig_ObjIsMuxType( pNode )";
      uVar3 = 0x33;
    }
    else {
      pAVar7 = Aig_ObjRecognizeMux(pNode,&pNodeT,&pNodeE);
      pAVar4 = pNodeE;
      piVar1 = p->pSatVars;
      local_38 = (ulong)(uint)piVar1[*(int *)(((ulong)pNodeT & 0xfffffffffffffffe) + 0x24)];
      local_40 = (ulong)(uint)piVar1[*(int *)(((ulong)pNodeE & 0xfffffffffffffffe) + 0x24)];
      iVar5 = piVar1[pAVar7->Id] * 2 + 1;
      iVar2 = piVar1[pAVar7->Id] * 2;
      uVar11 = ((uint)pNodeT & 1) +
               piVar1[*(int *)(((ulong)pNodeT & 0xfffffffffffffffe) + 0x24)] * 2;
      uVar8 = uVar11 ^ 1;
      uVar3 = piVar1[pNode->Id] * 2;
      pLits[0] = iVar5;
      pLits[1] = uVar8;
      pLits[2] = uVar3;
      if (p->pPars->fPolarFlip != 0) {
        if ((pAVar7->field_0x18 & 8) != 0) {
          pLits[0] = iVar2;
        }
        if ((*(byte *)(((ulong)pNodeT & 0xfffffffffffffffe) + 0x18) & 8) != 0) {
          pLits[1] = uVar11;
        }
        if ((pNode->field_0x18 & 8) != 0) {
          pLits[2] = uVar3 | 1;
        }
      }
      iVar6 = sat_solver_addclause(p->pSat,pLits,pLits + 3);
      if (iVar6 == 0) {
        __assertion = "RetValue";
        uVar3 = 0x51;
      }
      else {
        uVar12 = uVar3 | 1;
        pLits[0] = iVar5;
        pLits[1] = uVar11;
        pLits[2] = uVar12;
        if (p->pPars->fPolarFlip != 0) {
          if ((pAVar7->field_0x18 & 8) != 0) {
            pLits[0] = iVar2;
          }
          if ((*(byte *)(((ulong)pNodeT & 0xfffffffffffffffe) + 0x18) & 8) != 0) {
            pLits[1] = uVar8;
          }
          if ((pNode->field_0x18 & 8) != 0) {
            pLits[2] = uVar3;
          }
        }
        iVar6 = sat_solver_addclause(p->pSat,pLits,pLits + 3);
        if (iVar6 == 0) {
          __assertion = "RetValue";
          uVar3 = 0x5c;
        }
        else {
          uVar9 = ((uint)pAVar4 & 1) + (int)local_40 * 2;
          uVar10 = uVar9 ^ 1;
          pLits[0] = iVar2;
          pLits[1] = uVar10;
          pLits[2] = uVar3;
          if (p->pPars->fPolarFlip != 0) {
            if ((pAVar7->field_0x18 & 8) != 0) {
              pLits[0] = iVar5;
            }
            if ((*(byte *)(((ulong)pNodeE & 0xfffffffffffffffe) + 0x18) & 8) != 0) {
              pLits[1] = uVar9;
            }
            if ((pNode->field_0x18 & 8) != 0) {
              pLits[2] = uVar12;
            }
          }
          iVar6 = sat_solver_addclause(p->pSat,pLits,pLits + 3);
          if (iVar6 == 0) {
            __assertion = "RetValue";
            uVar3 = 0x67;
          }
          else {
            pLits[0] = iVar2;
            pLits[1] = uVar9;
            pLits[2] = uVar12;
            if (p->pPars->fPolarFlip != 0) {
              if ((pAVar7->field_0x18 & 8) != 0) {
                pLits[0] = iVar5;
              }
              if ((*(byte *)(((ulong)pNodeE & 0xfffffffffffffffe) + 0x18) & 8) != 0) {
                pLits[1] = uVar10;
              }
              if ((pNode->field_0x18 & 8) != 0) {
                pLits[2] = uVar3;
              }
            }
            iVar5 = sat_solver_addclause(p->pSat,pLits,pLits + 3);
            if (iVar5 != 0) {
              if ((int)local_38 != (int)local_40) {
                pLits[0] = uVar11;
                pLits[1] = uVar9;
                pLits[2] = uVar12;
                if (p->pPars->fPolarFlip != 0) {
                  if ((*(byte *)(((ulong)pNodeT & 0xfffffffffffffffe) + 0x18) & 8) != 0) {
                    pLits[0] = uVar8;
                  }
                  if ((*(byte *)(((ulong)pNodeE & 0xfffffffffffffffe) + 0x18) & 8) != 0) {
                    pLits[1] = uVar10;
                  }
                  if ((pNode->field_0x18 & 8) != 0) {
                    pLits[2] = uVar3;
                  }
                }
                iVar5 = sat_solver_addclause(p->pSat,pLits,pLits + 3);
                if (iVar5 == 0) {
                  __assert_fail("RetValue",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchCnf.c"
                                ,0x8b,"void Dch_AddClausesMux(Dch_Man_t *, Aig_Obj_t *)");
                }
                pLits[0] = uVar8;
                pLits[1] = uVar10;
                pLits[2] = uVar3;
                if (p->pPars->fPolarFlip != 0) {
                  if ((*(byte *)(((ulong)pNodeT & 0xfffffffffffffffe) + 0x18) & 8) != 0) {
                    pLits[0] = uVar11;
                  }
                  if ((*(byte *)(((ulong)pNodeE & 0xfffffffffffffffe) + 0x18) & 8) != 0) {
                    pLits[1] = uVar9;
                  }
                  if ((pNode->field_0x18 & 8) != 0) {
                    pLits[2] = uVar12;
                  }
                }
                iVar5 = sat_solver_addclause(p->pSat,pLits,pLits + 3);
                if (iVar5 == 0) {
                  __assert_fail("RetValue",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchCnf.c"
                                ,0x96,"void Dch_AddClausesMux(Dch_Man_t *, Aig_Obj_t *)");
                }
              }
              return;
            }
            __assertion = "RetValue";
            uVar3 = 0x72;
          }
        }
      }
    }
  }
  else {
    __assertion = "!Aig_IsComplement( pNode )";
    uVar3 = 0x32;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchCnf.c"
                ,uVar3,"void Dch_AddClausesMux(Dch_Man_t *, Aig_Obj_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Addes clauses to the solver.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Dch_AddClausesMux( Dch_Man_t * p, Aig_Obj_t * pNode )
{
    Aig_Obj_t * pNodeI, * pNodeT, * pNodeE;
    int pLits[4], RetValue, VarF, VarI, VarT, VarE, fCompT, fCompE;

    assert( !Aig_IsComplement( pNode ) );
    assert( Aig_ObjIsMuxType( pNode ) );
    // get nodes (I = if, T = then, E = else)
    pNodeI = Aig_ObjRecognizeMux( pNode, &pNodeT, &pNodeE );
    // get the variable numbers
    VarF = Dch_ObjSatNum(p,pNode);
    VarI = Dch_ObjSatNum(p,pNodeI);
    VarT = Dch_ObjSatNum(p,Aig_Regular(pNodeT));
    VarE = Dch_ObjSatNum(p,Aig_Regular(pNodeE));
    // get the complementation flags
    fCompT = Aig_IsComplement(pNodeT);
    fCompE = Aig_IsComplement(pNodeE);

    // f = ITE(i, t, e)

    // i' + t' + f
    // i' + t  + f'
    // i  + e' + f
    // i  + e  + f'

    // create four clauses
    pLits[0] = toLitCond(VarI, 1);
    pLits[1] = toLitCond(VarT, 1^fCompT);
    pLits[2] = toLitCond(VarF, 0);
    if ( p->pPars->fPolarFlip )
    {
        if ( pNodeI->fPhase )               pLits[0] = lit_neg( pLits[0] );
        if ( Aig_Regular(pNodeT)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarI, 1);
    pLits[1] = toLitCond(VarT, 0^fCompT);
    pLits[2] = toLitCond(VarF, 1);
    if ( p->pPars->fPolarFlip )
    {
        if ( pNodeI->fPhase )               pLits[0] = lit_neg( pLits[0] );
        if ( Aig_Regular(pNodeT)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarI, 0);
    pLits[1] = toLitCond(VarE, 1^fCompE);
    pLits[2] = toLitCond(VarF, 0);
    if ( p->pPars->fPolarFlip )
    {
        if ( pNodeI->fPhase )               pLits[0] = lit_neg( pLits[0] );
        if ( Aig_Regular(pNodeE)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarI, 0);
    pLits[1] = toLitCond(VarE, 0^fCompE);
    pLits[2] = toLitCond(VarF, 1);
    if ( p->pPars->fPolarFlip )
    {
        if ( pNodeI->fPhase )               pLits[0] = lit_neg( pLits[0] );
        if ( Aig_Regular(pNodeE)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );

    // two additional clauses
    // t' & e' -> f'
    // t  & e  -> f 

    // t  + e   + f'
    // t' + e'  + f 

    if ( VarT == VarE )
    {
//        assert( fCompT == !fCompE );
        return;
    }

    pLits[0] = toLitCond(VarT, 0^fCompT);
    pLits[1] = toLitCond(VarE, 0^fCompE);
    pLits[2] = toLitCond(VarF, 1);
    if ( p->pPars->fPolarFlip )
    {
        if ( Aig_Regular(pNodeT)->fPhase )  pLits[0] = lit_neg( pLits[0] );
        if ( Aig_Regular(pNodeE)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarT, 1^fCompT);
    pLits[1] = toLitCond(VarE, 1^fCompE);
    pLits[2] = toLitCond(VarF, 0);
    if ( p->pPars->fPolarFlip )
    {
        if ( Aig_Regular(pNodeT)->fPhase )  pLits[0] = lit_neg( pLits[0] );
        if ( Aig_Regular(pNodeE)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
}